

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opcodes.c
# Opt level: O1

int Instructions(int loc)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  OpTab *pOVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char cVar10;
  char cVar11;
  int iVar12;
  
  if (optabsize == 0) {
    pOVar4 = MnemTab;
    uVar1 = 0;
    do {
      pOVar4 = pOVar4 + 1;
      uVar1 = uVar1 + 1;
    } while (pOVar4->Mnem[0] != '\0');
    oplimits[0] = 0;
    optabsize = uVar1;
    oplimits[0x1a] = uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = 0;
    }
    else {
      uVar6 = 0;
      uVar7 = 0;
      do {
        iVar9 = (int)MnemTab[uVar6].Mnem[0];
        if ((0x40 < iVar9) && (iVar9 - 0x40U != uVar7)) {
          uVar8 = uVar7 + 1;
          if ((int)uVar8 < (int)(iVar9 - 0x40U)) {
            piVar5 = oplimits + (int)uVar8;
            uVar7 = ~uVar7;
            do {
              *piVar5 = (int)uVar6;
              piVar5 = piVar5 + 1;
              uVar8 = uVar7 - 1;
              iVar12 = uVar7 + iVar9 + -0x41;
              uVar7 = uVar8;
            } while (iVar12 != 0);
            uVar8 = -uVar8;
          }
          uVar7 = uVar8;
          oplimits[uVar7] = (int)uVar6;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar1);
    }
    if ((int)uVar7 < 0x19) {
      lVar2 = (long)(int)uVar7 + 1;
      do {
        oplimits[lVar2] = uVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x1a);
    }
  }
  iVar12 = (int)OpCode[0];
  iVar9 = 0;
  if (iVar12 < 0x40) {
    piVar5 = oplimits + 1;
  }
  else {
    iVar3 = 0;
    if ('Z' < OpCode[0]) goto LAB_00109184;
    iVar9 = oplimits[iVar12 - 0x40];
    piVar5 = oplimits + (iVar12 - 0x3f);
  }
  iVar3 = *piVar5;
LAB_00109184:
  if (iVar9 < iVar3) {
    do {
      iVar12 = (iVar3 + iVar9) / 2;
      cVar10 = MnemTab[iVar12].Mnem[0];
      cVar11 = OpCode[0];
      if ((OpCode[0] != '\0') && (OpCode[0] == cVar10)) {
        lVar2 = 1;
        do {
          cVar11 = OpCode[lVar2];
          cVar10 = MnemTab[iVar12].Mnem[lVar2];
          if (cVar11 == '\0') break;
          lVar2 = lVar2 + 1;
        } while (cVar11 == cVar10);
      }
      if (cVar10 <= cVar11) {
        if (cVar11 <= cVar10) {
          AdrModeA = MnemTab[iVar12].AMA;
          if (AdrModeA == 0xffff) {
            AdrModeB = 0;
            AdrModeA = 0;
            Op = 0;
            Dir = MnemTab[iVar12].AMB;
          }
          else {
            Op = MnemTab[iVar12].OpBits;
            AdrModeB = MnemTab[iVar12].AMB;
            Dir = 0;
          }
          return 1;
        }
        iVar9 = iVar12 + 1;
        iVar12 = iVar3;
      }
      iVar3 = iVar12;
    } while (iVar9 < iVar3);
  }
  Op = 0;
  AdrModeB = 0;
  AdrModeA = 0;
  Dir = 0;
  return 0;
}

Assistant:

int Instructions(int loc)
/* Looks up opcode and addressing mode bit patterns
 If the opcode corresponds to an executable instruction,
 returns TRUE with the following fields set up:
 Op       - operation code bits
 AdrModeA - addressing mode bits
 AdrModeB - more addressing mode bits
 Dir      - None
 If the opcode corresponds to a directive (AdrModeA in the table
 is 0xFFFF), returns TRUE with the following fields set up:
 Op       - 0
 AdrModeA - 0
 AdrModeB - 0
 Dir      - the appropriate directive value
 If not found, returns FALSE with all the above fields set to zero.

 NOTE: The binary search doesn't use strcmp because this function
 returns incorrect values under MS-DOS Lattice 2.12.		      */
{

// For the love of god. strcmp is slower than C implementation. -- Alkis
//#define USESTRCMP
#ifdef USESTRCMP
	register int cmp;
#else
	register char *i, *j;
#endif
	register int lower, upper, mid; /* Binary search controls */

	if (optabsize == 0) { /* Determine size of opcode table. */
		while (MnemTab[optabsize].Mnem[0])
			optabsize++;
		oplimits[0] = 0;
		oplimits['Z' - 'A' + 1] = optabsize;
		mid = 0;
		for (lower = 0; lower < optabsize; lower++) {
			upper = (unsigned int) MnemTab[lower].Mnem[0] - 'A' + 1;
			if (upper != mid) {
				if (upper > 0) { /* Start of the next letter */
					mid++;
					while (mid < upper)
						oplimits[mid++] = lower;
					oplimits[mid] = lower;
				}
			}
		}
		mid++;
		while (mid < 'Z' - 'A' + 1) {
			oplimits[mid++] = optabsize; /* In case we didn't get to Z */
		}
	}

	mid = (unsigned int) OpCode[0] - 'A' + 1;
	if (mid < 0) { /* This catches stuff like "=". */
		lower = 0;
		upper = oplimits[1];
	} else if (mid > 'Z' - 'A' + 1) {
		lower = upper = 0; /* Reject this one. */
	} else {
		lower = oplimits[mid++];
		upper = oplimits[mid];
	}
	while (lower < upper) {
		mid = (lower + upper) / 2; /* Search the opcode table. */
#ifdef USESTRCMP
		cmp = strcmp(OpCode,MnemTab[mid].Mnem);
		if (cmp<0) {
			upper = mid; /* Search lower half of table. */
		} else if (cmp>0) {
			lower = mid + 1; /* Search upper half of table. */
#else
		for (i = OpCode, j = MnemTab[mid].Mnem; *i == *j; i++, j++)
			if (*i == '\0')
				break; /* Find the first non-match. */
		if (*i < *j) {
			upper = mid; /* Search lower half of table. */
		} else if (*i > *j) {
			lower = mid + 1; /* Search upper half of table. */
#endif
		}else if (MnemTab[mid].AMA != 0xFFFF) { /* Found it. */
			Op = MnemTab[mid].OpBits; /* Executable instruction */
			AdrModeA = MnemTab[mid].AMA;
			AdrModeB = MnemTab[mid].AMB;
			Dir = None;
			return (TRUE);
		} else {
			Op = AdrModeA = AdrModeB = 0; /* Directive */
			Dir = MnemTab[mid].AMB;
			return (TRUE);
		}
	}
	Op = AdrModeA = AdrModeB = Dir = 0;
	return (FALSE); /* We didn't find it. */
}